

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

TrieNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_block<unsigned_char_*,_1024U> *bucket,
          size_t depth)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  TrieNode<unsigned_char> *this_00;
  size_t sVar4;
  uchar *puVar5;
  reference ppuVar6;
  reference pvVar7;
  byte *pbVar8;
  reference ppvVar9;
  vector_block<unsigned_char_*,_1024U> *this_01;
  vector_block<unsigned_char_*,_1024U> *local_2b0;
  vector_block<unsigned_char_*,_1024U> *sub_bucket_1;
  uchar *puStack_2a0;
  uchar ch_1;
  uchar *ptr;
  vector_block<unsigned_char_*,_1024U> *sub_bucket;
  uint local_288;
  uint uStack_284;
  uchar ch;
  uint j_1;
  uint j;
  array<unsigned_char_*,_64UL> strings;
  array<unsigned_char,_64UL> cache;
  uint i;
  uint bucket_size;
  TrieNode<unsigned_char> *new_node;
  size_t depth_local;
  vector_block<unsigned_char_*,_1024U> *bucket_local;
  BurstSimple<unsigned_char> *this_local;
  
  this_00 = (TrieNode<unsigned_char> *)operator_new(0x820);
  TrieNode<unsigned_char>::TrieNode(this_00);
  sVar4 = vector_block<unsigned_char_*,_1024U>::size(bucket);
  uVar3 = (uint)sVar4;
  cache._M_elems[0x38] = '\0';
  cache._M_elems[0x39] = '\0';
  cache._M_elems[0x3a] = '\0';
  cache._M_elems[0x3b] = '\0';
  for (; (uint)cache._M_elems._56_4_ < uVar3 - (uVar3 & 0x3f);
      cache._M_elems._56_4_ = cache._M_elems._56_4_ + 0x40) {
    for (uStack_284 = 0; uStack_284 < 0x40; uStack_284 = uStack_284 + 1) {
      puVar5 = vector_block<unsigned_char_*,_1024U>::operator[]
                         (bucket,(ulong)(cache._M_elems._56_4_ + uStack_284));
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_284);
      *ppuVar6 = puVar5;
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_284);
      uVar1 = get_char<unsigned_char>(*ppuVar6,depth);
      pvVar7 = std::array<unsigned_char,_64UL>::operator[]
                         ((array<unsigned_char,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)uStack_284);
      *pvVar7 = uVar1;
    }
    for (local_288 = 0; local_288 < 0x40; local_288 = local_288 + 1) {
      pbVar8 = std::array<unsigned_char,_64UL>::operator[]
                         ((array<unsigned_char,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)local_288);
      sub_bucket._7_1_ = *pbVar8;
      ppvVar9 = std::array<void_*,_256UL>::operator[]
                          ((array<void_*,_256UL> *)this_00,(ulong)sub_bucket._7_1_);
      ptr = (uchar *)*ppvVar9;
      if (ptr == (uchar *)0x0) {
        this_01 = (vector_block<unsigned_char_*,_1024U> *)operator_new(0x28);
        vector_block<unsigned_char_*,_1024U>::vector_block(this_01);
        ptr = (uchar *)this_01;
        ppvVar9 = std::array<void_*,_256UL>::operator[]
                            ((array<void_*,_256UL> *)this_00,(ulong)sub_bucket._7_1_);
        *ppvVar9 = this_01;
      }
      puVar5 = ptr;
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)local_288);
      vector_block<unsigned_char_*,_1024U>::push_back
                ((vector_block<unsigned_char_*,_1024U> *)puVar5,ppuVar6);
    }
  }
  for (; (uint)cache._M_elems._56_4_ < uVar3; cache._M_elems._56_4_ = cache._M_elems._56_4_ + 1) {
    puStack_2a0 = vector_block<unsigned_char_*,_1024U>::operator[]
                            (bucket,(ulong)(uint)cache._M_elems._56_4_);
    bVar2 = get_char<unsigned_char>(puStack_2a0,depth);
    ppvVar9 = std::array<void_*,_256UL>::operator[]((array<void_*,_256UL> *)this_00,(ulong)bVar2);
    local_2b0 = (vector_block<unsigned_char_*,_1024U> *)*ppvVar9;
    if (local_2b0 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
      local_2b0 = (vector_block<unsigned_char_*,_1024U> *)operator_new(0x28);
      vector_block<unsigned_char_*,_1024U>::vector_block(local_2b0);
      ppvVar9 = std::array<void_*,_256UL>::operator[]((array<void_*,_256UL> *)this_00,(ulong)bVar2);
      *ppvVar9 = local_2b0;
    }
    vector_block<unsigned_char_*,_1024U>::push_back(local_2b0,&stack0xfffffffffffffd60);
  }
  return this_00;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}